

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::operator==
          (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *rhs)

{
  ConstMemberIterator this_00;
  bool bVar1;
  Type TVar2;
  Type TVar3;
  Pointer pVVar4;
  Pointer pVVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this_01;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_00;
  double dVar6;
  double dVar7;
  bool local_91;
  byte local_71;
  double b;
  double a;
  ConstMemberIterator CStack_40;
  SizeType i;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_38;
  ConstMemberIterator rhsMemberItr;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_28;
  ConstMemberIterator lhsMemberItr;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  lhsMemberItr.ptr_ = (Pointer)rhs;
  TVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetType
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
  TVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetType((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)lhsMemberItr.ptr_);
  if (TVar2 == TVar3) {
    TVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetType
                      ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
    switch(TVar2) {
    case kObjectType:
      if (*(SizeType *)this == ((lhsMemberItr.ptr_)->name).data_.s.length) {
        local_28.ptr_ =
             (Pointer)GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberBegin
                                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                                 this);
        while( true ) {
          rhsMemberItr.ptr_ =
               (Pointer)GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
                                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                                   this);
          bVar1 = GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
                  operator!=((GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                              *)&local_28,
                             (GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                              *)&rhsMemberItr);
          this_00 = lhsMemberItr;
          if (!bVar1) break;
          pVVar4 = GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
                   operator->(&local_28);
          local_38.ptr_ =
               (Pointer)GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::FindMember<rapidjson::CrtAllocator>
                                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)this_00.ptr_,&pVVar4->name);
          CStack_40 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                   *)lhsMemberItr.ptr_);
          bVar1 = GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator==((GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)&local_38,&stack0xffffffffffffffc0);
          local_71 = 1;
          if (!bVar1) {
            pVVar4 = GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
                     operator->(&local_28);
            pVVar5 = GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::operator->(&local_38);
            bVar1 = operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                               &pVVar4->value,&pVVar5->value);
            local_71 = bVar1 ^ 0xff;
          }
          if ((local_71 & 1) != 0) {
            return false;
          }
          GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator++
                    (&local_28);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case kArrayType:
      if (*(SizeType *)this == ((lhsMemberItr.ptr_)->name).data_.s.length) {
        for (a._4_4_ = 0; a._4_4_ < *(uint *)this; a._4_4_ = a._4_4_ + 1) {
          this_01 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator[]
                              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                               a._4_4_);
          rhs_00 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[]((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)lhsMemberItr.ptr_,a._4_4_);
          bVar1 = operator==(this_01,rhs_00);
          if (!bVar1) {
            return false;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case kStringType:
      this_local._7_1_ =
           StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     (this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)lhsMemberItr.ptr_);
      break;
    case kNumberType:
      bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsDouble
                        ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
      if ((bVar1) ||
         (bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::IsDouble((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)lhsMemberItr.ptr_), bVar1)) {
        dVar6 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble
                          ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
        dVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetDouble((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)lhsMemberItr.ptr_);
        local_91 = dVar7 <= dVar6 && dVar6 <= dVar7;
        this_local._7_1_ = local_91;
      }
      else {
        this_local._7_1_ = *(long *)this == ((lhsMemberItr.ptr_)->name).data_.n.i64;
      }
      break;
    default:
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const GenericValue<Encoding, SourceAllocator>& rhs) const {
        typedef GenericValue<Encoding, SourceAllocator> RhsType;
        if (GetType() != rhs.GetType())
            return false;

        switch (GetType()) {
        case kObjectType: // Warning: O(n^2) inner-loop
            if (data_.o.size != rhs.data_.o.size)
                return false;           
            for (ConstMemberIterator lhsMemberItr = MemberBegin(); lhsMemberItr != MemberEnd(); ++lhsMemberItr) {
                typename RhsType::ConstMemberIterator rhsMemberItr = rhs.FindMember(lhsMemberItr->name);
                if (rhsMemberItr == rhs.MemberEnd() || (!(lhsMemberItr->value == rhsMemberItr->value)))
                    return false;
            }
            return true;
            
        case kArrayType:
            if (data_.a.size != rhs.data_.a.size)
                return false;
            for (SizeType i = 0; i < data_.a.size; i++)
                if (!((*this)[i] == rhs[i]))
                    return false;
            return true;

        case kStringType:
            return StringEqual(rhs);

        case kNumberType:
            if (IsDouble() || rhs.IsDouble()) {
                double a = GetDouble();     // May convert from integer to double.
                double b = rhs.GetDouble(); // Ditto
                return a >= b && a <= b;    // Prevent -Wfloat-equal
            }
            else
                return data_.n.u64 == rhs.data_.n.u64;

        default:
            return true;
        }
    }